

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderStorageBufferObjectTests.cpp
# Opt level: O0

long __thiscall gl4cts::anon_unknown_0::BasicAtomicCase4CS::Run(BasicAtomicCase4CS *this)

{
  bool bVar1;
  GLuint GVar2;
  undefined4 *puVar3;
  void *pvVar4;
  uint local_7c;
  GLint i_1;
  GLint *idata;
  GLuint i;
  GLuint *udata;
  int *ptr;
  allocator<char> local_41;
  string local_40;
  char *local_20;
  char *glsl_cs;
  BasicAtomicCase4CS *this_local;
  
  local_20 = 
  "\nlayout(local_size_x = 2, local_size_y = 2, local_size_z = 2) in;\nlayout(std430, binding = 0) coherent buffer Counters {\n  uint g_uint_counter;\n  int g_int_counter;\n};\nlayout(std430, binding = 1) buffer Output {\n  uint udata[8];\n  int idata[8];\n} g_output;\nvoid main() {\n  uint uidx = atomicAdd(g_uint_counter, 1u);\n  int iidx = atomicAdd(g_int_counter, -1);\n  g_output.udata[uidx] = uidx;\n  g_output.idata[iidx] = iidx;\n}"
  ;
  glsl_cs = (char *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,
             "\nlayout(local_size_x = 2, local_size_y = 2, local_size_z = 2) in;\nlayout(std430, binding = 0) coherent buffer Counters {\n  uint g_uint_counter;\n  int g_int_counter;\n};\nlayout(std430, binding = 1) buffer Output {\n  uint udata[8];\n  int idata[8];\n} g_output;\nvoid main() {\n  uint uidx = atomicAdd(g_uint_counter, 1u);\n  int iidx = atomicAdd(g_int_counter, -1);\n  g_output.udata[uidx] = uidx;\n  g_output.idata[iidx] = iidx;\n}"
             ,&local_41);
  GVar2 = ShaderStorageBufferObjectBase::CreateProgramCS
                    (&this->super_ShaderStorageBufferObjectBase,&local_40);
  this->m_program = GVar2;
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  glu::CallLogWrapper::glLinkProgram
            (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,this->m_program);
  bVar1 = ShaderStorageBufferObjectBase::CheckProgram
                    (&this->super_ShaderStorageBufferObjectBase,this->m_program);
  if (bVar1) {
    glu::CallLogWrapper::glGenBuffers
              (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,2,this->m_storage_buffer);
    glu::CallLogWrapper::glBindBufferBase
              (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x90d2,0,this->m_storage_buffer[0]);
    glu::CallLogWrapper::glBufferData
              (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x90d2,8,(void *)0x0,0x88e8);
    puVar3 = (undefined4 *)
             glu::CallLogWrapper::glMapBufferRange
                       (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.
                         super_GLWrapper.super_CallLogWrapper,0x90d2,0,8,2);
    if (puVar3 == (undefined4 *)0x0) {
      this_local = (BasicAtomicCase4CS *)&DAT_ffffffffffffffff;
    }
    else {
      *puVar3 = 0;
      puVar3[1] = 7;
      glu::CallLogWrapper::glUnmapBuffer
                (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x90d2);
      glu::CallLogWrapper::glBindBufferBase
                (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x90d2,1,this->m_storage_buffer[1]);
      glu::CallLogWrapper::glBufferData
                (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x90d2,0x40,(void *)0x0,0x88e8);
      glu::CallLogWrapper::glUseProgram
                (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,this->m_program);
      glu::CallLogWrapper::glDispatchCompute
                (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,1,1,1);
      glu::CallLogWrapper::glMemoryBarrier
                (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x200);
      pvVar4 = glu::CallLogWrapper::glMapBufferRange
                         (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.
                           super_GLWrapper.super_CallLogWrapper,0x90d2,0,0x20,1);
      if (pvVar4 == (void *)0x0) {
        this_local = (BasicAtomicCase4CS *)&DAT_ffffffffffffffff;
      }
      else {
        for (idata._4_4_ = 0; idata._4_4_ < 8; idata._4_4_ = idata._4_4_ + 1) {
          if (*(uint *)((long)pvVar4 + (ulong)idata._4_4_ * 4) != idata._4_4_) {
            anon_unknown_0::Output
                      ("uData at index %d is %d should be %d.\n",(ulong)idata._4_4_,
                       (ulong)*(uint *)((long)pvVar4 + (ulong)idata._4_4_ * 4),(ulong)idata._4_4_);
            return (long)&DAT_ffffffffffffffff;
          }
        }
        glu::CallLogWrapper::glUnmapBuffer
                  (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,0x90d2);
        pvVar4 = glu::CallLogWrapper::glMapBufferRange
                           (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.
                             super_GLWrapper.super_CallLogWrapper,0x90d2,0x20,0x20,1);
        if (pvVar4 == (void *)0x0) {
          this_local = (BasicAtomicCase4CS *)&DAT_ffffffffffffffff;
        }
        else {
          for (local_7c = 0; (int)local_7c < 8; local_7c = local_7c + 1) {
            if (*(uint *)((long)pvVar4 + (long)(int)local_7c * 4) != local_7c) {
              anon_unknown_0::Output
                        ("iData at index %d is %d should be %d.\n",(ulong)local_7c,
                         (ulong)*(uint *)((long)pvVar4 + (long)(int)local_7c * 4),(ulong)local_7c);
              return (long)&DAT_ffffffffffffffff;
            }
          }
          glu::CallLogWrapper::glUnmapBuffer
                    (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                      super_CallLogWrapper,0x90d2);
          this_local = (BasicAtomicCase4CS *)0x0;
        }
      }
    }
  }
  else {
    this_local = (BasicAtomicCase4CS *)&DAT_ffffffffffffffff;
  }
  return (long)this_local;
}

Assistant:

virtual long Run()
	{
		const char* const glsl_cs =
			NL "layout(local_size_x = 2, local_size_y = 2, local_size_z = 2) in;" NL
			   "layout(std430, binding = 0) coherent buffer Counters {" NL "  uint g_uint_counter;" NL
			   "  int g_int_counter;" NL "};" NL "layout(std430, binding = 1) buffer Output {" NL "  uint udata[8];" NL
			   "  int idata[8];" NL "} g_output;" NL "void main() {" NL
			   "  uint uidx = atomicAdd(g_uint_counter, 1u);" NL "  int iidx = atomicAdd(g_int_counter, -1);" NL
			   "  g_output.udata[uidx] = uidx;" NL "  g_output.idata[iidx] = iidx;" NL "}";
		m_program = CreateProgramCS(glsl_cs);
		glLinkProgram(m_program);
		if (!CheckProgram(m_program))
			return ERROR;

		glGenBuffers(2, m_storage_buffer);
		/* counter buffer */
		{
			glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 0, m_storage_buffer[0]);
			glBufferData(GL_SHADER_STORAGE_BUFFER, 2 * sizeof(int), NULL, GL_DYNAMIC_DRAW);
			int* ptr = reinterpret_cast<int*>(glMapBufferRange(GL_SHADER_STORAGE_BUFFER, 0, 8, GL_MAP_WRITE_BIT));
			if (!ptr)
				return ERROR;
			*ptr++ = 0;
			*ptr++ = 7;
			glUnmapBuffer(GL_SHADER_STORAGE_BUFFER);
		}
		/* output buffer */
		{
			glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 1, m_storage_buffer[1]);
			glBufferData(GL_SHADER_STORAGE_BUFFER, 16 * sizeof(int), NULL, GL_DYNAMIC_DRAW);
		}
		glUseProgram(m_program);
		glDispatchCompute(1, 1, 1);
		glMemoryBarrier(GL_BUFFER_UPDATE_BARRIER_BIT);

		GLuint* udata = (GLuint*)glMapBufferRange(GL_SHADER_STORAGE_BUFFER, 0, 32, GL_MAP_READ_BIT);
		if (!udata)
			return ERROR;
		for (GLuint i = 0; i < 8; ++i)
		{
			if (udata[i] != i)
			{
				Output("uData at index %d is %d should be %d.\n", i, udata[i], i);
				return ERROR;
			}
		}
		glUnmapBuffer(GL_SHADER_STORAGE_BUFFER);
		GLint* idata = (GLint*)glMapBufferRange(GL_SHADER_STORAGE_BUFFER, 32, 32, GL_MAP_READ_BIT);
		if (!idata)
			return ERROR;
		for (GLint i = 0; i < 8; ++i)
		{
			if (idata[i] != i)
			{
				Output("iData at index %d is %d should be %d.\n", i, idata[i], i);
				return ERROR;
			}
		}
		glUnmapBuffer(GL_SHADER_STORAGE_BUFFER);
		return NO_ERROR;
	}